

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::~QArrayDataPointer
          (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *this)

{
  bool bVar1;
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *in_RDI;
  
  bVar1 = deref(in_RDI);
  if (!bVar1) {
    operator->(in_RDI);
    QtPrivate::QGenericArrayOps<(anonymous_namespace)::ButtonInfo>::destroyAll
              ((QGenericArrayOps<(anonymous_namespace)::ButtonInfo> *)in_RDI);
    QTypedArrayData<(anonymous_namespace)::ButtonInfo>::deallocate((QArrayData *)0x445b2b);
  }
  return;
}

Assistant:

~QArrayDataPointer()
    {
        if (!deref()) {
            (*this)->destroyAll();
            Data::deallocate(d);
        }
    }